

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_proxy_auth(Curl_easy *data,connectdata *conn)

{
  char *local_40;
  char *local_38;
  CURLcode local_2c;
  CURLcode result;
  char *proxypasswd;
  char *proxyuser;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->state).aptr.proxyuser == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = (data->state).aptr.proxyuser;
  }
  if ((data->state).aptr.proxypasswd == (char *)0x0) {
    local_40 = "";
  }
  else {
    local_40 = (data->state).aptr.proxypasswd;
  }
  local_2c = CURLE_OK;
  if ((local_38 != (char *)0x0) &&
     (local_2c = Curl_urldecode(local_38,0,&(conn->http_proxy).user,(size_t *)0x0,REJECT_ZERO),
     local_2c == CURLE_OK)) {
    local_2c = Curl_setstropt(&(data->state).aptr.proxyuser,(conn->http_proxy).user);
  }
  if (((local_2c == CURLE_OK) && (local_40 != (char *)0x0)) &&
     (local_2c = Curl_urldecode(local_40,0,&(conn->http_proxy).passwd,(size_t *)0x0,REJECT_ZERO),
     local_2c == CURLE_OK)) {
    local_2c = Curl_setstropt(&(data->state).aptr.proxypasswd,(conn->http_proxy).passwd);
  }
  return local_2c;
}

Assistant:

static CURLcode parse_proxy_auth(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  const char *proxyuser = data->state.aptr.proxyuser ?
    data->state.aptr.proxyuser : "";
  const char *proxypasswd = data->state.aptr.proxypasswd ?
    data->state.aptr.proxypasswd : "";
  CURLcode result = CURLE_OK;

  if(proxyuser) {
    result = Curl_urldecode(proxyuser, 0, &conn->http_proxy.user, NULL,
                            REJECT_ZERO);
    if(!result)
      result = Curl_setstropt(&data->state.aptr.proxyuser,
                              conn->http_proxy.user);
  }
  if(!result && proxypasswd) {
    result = Curl_urldecode(proxypasswd, 0, &conn->http_proxy.passwd,
                            NULL, REJECT_ZERO);
    if(!result)
      result = Curl_setstropt(&data->state.aptr.proxypasswd,
                              conn->http_proxy.passwd);
  }
  return result;
}